

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor.cpp
# Opt level: O0

Error * __thiscall
ot::commissioner::CborMap::Get(Error *__return_storage_ptr__,CborMap *this,int aKey,CborMap *aMap)

{
  v10 *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar1;
  format_args args;
  string_view fmt;
  anon_class_1_0_00000001 local_112;
  v10 local_111;
  v10 *local_110;
  char *local_108;
  string local_100;
  cn_cbor *local_e0;
  cn_cbor *cbor;
  CborMap *aMap_local;
  CborMap *pCStack_c8;
  int aKey_local;
  CborMap *this_local;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_int> *local_b8 [3];
  undefined1 local_a0 [16];
  v10 *local_90;
  char *local_88;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_int> *local_80;
  v10 *local_78;
  char *pcStack_70;
  string *local_68;
  v10 *local_60;
  v10 **local_58;
  v10 **local_50;
  v10 *local_48;
  char *pcStack_40;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_int> **local_38;
  undefined1 *local_30;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_int> **local_28;
  undefined8 local_20;
  undefined1 *local_18;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_int> **local_10;
  
  this_00 = (v10 *)(ulong)(uint)aKey;
  cbor = (cn_cbor *)aMap;
  aMap_local._4_4_ = aKey;
  pCStack_c8 = this;
  this_local = (CborMap *)__return_storage_ptr__;
  local_e0 = cn_cbor_mapget_int((this->super_CborValue).mCbor,aKey);
  if (local_e0 == (cn_cbor *)0x0) {
    Get::anon_class_1_0_00000001::operator()(&local_112);
    local_58 = &local_110;
    local_60 = &local_111;
    bVar1 = ::fmt::v10::operator()(local_60);
    local_108 = (char *)bVar1.size_;
    local_110 = (v10 *)bVar1.data_;
    ::fmt::v10::detail::check_format_string<int_&,_FMT_COMPILE_STRING,_0>();
    local_78 = local_110;
    pcStack_70 = local_108;
    local_80 = (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_int> *)
               ((long)&aMap_local + 4);
    local_50 = &local_78;
    local_90 = local_110;
    local_88 = local_108;
    local_68 = &local_100;
    local_48 = local_90;
    pcStack_40 = local_88;
    local_b8[0] = ::fmt::v10::
                  make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,int>
                            (local_80,this_00,(int *)&local_100);
    local_30 = local_a0;
    local_38 = local_b8;
    local_20 = 1;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_38;
    fmt.size_ = 1;
    fmt.data_ = local_88;
    local_28 = local_38;
    local_18 = local_30;
    local_10 = local_38;
    ::fmt::v10::vformat_abi_cxx11_(&local_100,local_90,fmt,args);
    Error::Error(__return_storage_ptr__,kNotFound,&local_100);
    std::__cxx11::string::~string((string *)&local_100);
  }
  else {
    *(undefined1 *)&cbor->v = 0;
    *(cn_cbor **)&cbor->length = local_e0;
    Error::Error(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Error CborMap::Get(int aKey, CborMap &aMap) const
{
    cn_cbor *cbor = cn_cbor_mapget_int(mCbor, aKey);
    if (cbor == nullptr)
    {
        return ERROR_NOT_FOUND("CBOR map cannot find entry of {}", aKey);
    }

    aMap.mIsRoot = false;
    aMap.mCbor   = cbor;
    return ERROR_NONE;
}